

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  uint uVar10;
  BYTE *pBVar11;
  U32 UVar12;
  uint uVar13;
  long lVar14;
  BYTE *litEnd_1;
  ulong uVar15;
  uint uVar16;
  U32 UVar17;
  U32 UVar18;
  BYTE *litEnd;
  int *iend;
  int *piVar19;
  ulong uVar20;
  U32 maxDistance;
  BYTE *litLimit_w;
  size_t ofbCandidate;
  U32 local_a4;
  size_t local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  int *local_60;
  uint local_54;
  BYTE *local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_48 = (BYTE *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_68 = (ms->window).base;
  local_70 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_78 = local_68 + uVar2;
  uVar5 = (ms->window).lowLimit;
  uVar10 = (ms->cParams).windowLog;
  uVar13 = (ms->cParams).minMatch;
  uVar16 = 6;
  if (uVar13 < 6) {
    uVar16 = uVar13;
  }
  local_54 = 4;
  if (4 < uVar16) {
    local_54 = uVar16;
  }
  UVar18 = *rep;
  local_a4 = rep[1];
  ms->lazySkipping = 0;
  piVar19 = (int *)((ulong)(local_78 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar19 < local_60) {
    local_50 = local_70 + uVar2;
    local_38 = local_70 + uVar5;
    uVar5 = 1 << ((byte)uVar10 & 0x1f);
    ilimit_w = (int *)(local_48 + -0x20);
    do {
      iVar6 = ((int)piVar19 - (int)local_68) + 1;
      UVar17 = (ms->window).lowLimit;
      UVar12 = iVar6 - uVar5;
      if (iVar6 - UVar17 <= uVar5) {
        UVar12 = UVar17;
      }
      if (ms->loadedDictEnd != 0) {
        UVar12 = UVar17;
      }
      uVar10 = iVar6 - UVar18;
      pBVar11 = local_68;
      if (uVar10 < uVar2) {
        pBVar11 = local_70;
      }
      iend = (int *)((long)piVar19 + 1);
      UVar17 = UVar18;
      if ((((uVar2 - 1) - uVar10 < 3) || (iVar6 - UVar12 < UVar18)) ||
         (*iend != *(int *)(pBVar11 + uVar10))) {
        local_80 = 999999999;
        if (local_54 == 6) {
          uVar15 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar19,local_48,&local_80);
        }
        else if (local_54 == 5) {
          uVar15 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar19,local_48,&local_80);
        }
        else {
          uVar15 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar19,local_48,&local_80);
        }
        uVar20 = local_80;
        piVar4 = piVar19;
        if (uVar15 == 0) {
          uVar20 = 1;
          piVar4 = iend;
        }
        iend = piVar4;
        UVar12 = (U32)uVar20;
        if (3 < uVar15) {
          if (3 < local_80) {
            uVar20 = (long)piVar19 + (3 - (long)(local_68 + local_80));
            pBVar8 = local_78;
            pBVar11 = local_68;
            if ((uint)uVar20 < uVar2) {
              pBVar8 = local_38;
              pBVar11 = local_70;
            }
            if ((src < piVar19) && (uVar20 = uVar20 & 0xffffffff, pBVar8 < pBVar11 + uVar20)) {
              pBVar11 = pBVar11 + uVar20;
              do {
                piVar19 = (int *)((long)iend + -1);
                pBVar11 = pBVar11 + -1;
                if ((*(BYTE *)piVar19 != *pBVar11) ||
                   (uVar15 = uVar15 + 1, iend = piVar19, piVar19 <= src)) break;
              } while (pBVar8 < pBVar11);
            }
            UVar17 = UVar12 - 3;
            local_a4 = UVar18;
          }
          goto LAB_018c8f68;
        }
        ms->lazySkipping = (uint)(0x8ff < (ulong)((long)piVar19 - (long)src));
        piVar19 = (int *)((long)piVar19 + ((ulong)((long)piVar19 - (long)src) >> 8) + 1);
      }
      else {
        pBVar8 = local_48;
        if (uVar10 < uVar2) {
          pBVar8 = local_50;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 5),(BYTE *)((long)(pBVar11 + uVar10) + 4),
                           local_48,pBVar8,local_78);
        uVar15 = sVar7 + 4;
        UVar12 = 1;
LAB_018c8f68:
        uVar20 = (long)iend - (long)src;
        pBVar11 = seqStore->lit;
        if (ilimit_w < iend) {
          ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_018c8f92:
          seqStore->lit = seqStore->lit + uVar20;
          psVar9 = seqStore->sequences;
          if (0xffff < uVar20) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar11 = *src;
          *(undefined8 *)(pBVar11 + 8) = uVar3;
          pBVar11 = seqStore->lit;
          if (0x10 < uVar20) {
            uVar3 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar11 + 0x18) = uVar3;
            if (0x20 < (long)uVar20) {
              lVar14 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar14 + 0x20);
                uVar3 = puVar1[1];
                pBVar8 = pBVar11 + lVar14 + 0x20;
                *(undefined8 *)pBVar8 = *puVar1;
                *(undefined8 *)(pBVar8 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)src + lVar14 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar8 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar8 + 0x18) = uVar3;
                lVar14 = lVar14 + 0x20;
              } while (pBVar8 + 0x20 < pBVar11 + uVar20);
            }
            goto LAB_018c8f92;
          }
          seqStore->lit = pBVar11 + uVar20;
          psVar9 = seqStore->sequences;
        }
        psVar9->litLength = (U16)uVar20;
        psVar9->offBase = UVar12;
        if (0xffff < uVar15 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9->mlBase = (U16)(uVar15 - 3);
        seqStore->sequences = psVar9 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        src = (void *)((long)iend + uVar15);
        piVar19 = (int *)src;
        UVar18 = UVar17;
        if (src <= local_60) {
          do {
            uVar10 = local_a4;
            iVar6 = (int)src - (int)local_68;
            UVar18 = (ms->window).lowLimit;
            UVar12 = iVar6 - uVar5;
            if (iVar6 - UVar18 <= uVar5) {
              UVar12 = UVar18;
            }
            if (ms->loadedDictEnd != 0) {
              UVar12 = UVar18;
            }
            uVar13 = iVar6 - uVar10;
            pBVar11 = local_68;
            if (uVar13 < uVar2) {
              pBVar11 = local_70;
            }
            piVar19 = (int *)src;
            UVar18 = UVar17;
            local_a4 = uVar10;
            if ((((uVar2 - 1) - uVar13 < 3) || (iVar6 - UVar12 < uVar10)) ||
               (*src != *(int *)(pBVar11 + uVar13))) break;
            pBVar8 = local_48;
            if (uVar13 < uVar2) {
              pBVar8 = local_50;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar11 + uVar13) + 4),
                               local_48,pBVar8,local_78);
            pBVar11 = seqStore->lit;
            if (ilimit_w < src) {
              ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
            }
            else {
              uVar3 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar11 = *src;
              *(undefined8 *)(pBVar11 + 8) = uVar3;
            }
            psVar9 = seqStore->sequences;
            psVar9->litLength = 0;
            psVar9->offBase = 1;
            if (0xffff < sVar7 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar9->mlBase = (U16)(sVar7 + 1);
            seqStore->sequences = psVar9 + 1;
            src = (void *)((long)src + sVar7 + 4);
            piVar19 = (int *)src;
            UVar18 = uVar10;
            local_a4 = UVar17;
            UVar17 = uVar10;
          } while (src <= local_60);
        }
      }
    } while (piVar19 < local_60);
  }
  *local_40 = UVar18;
  local_40[1] = local_a4;
  return (long)local_48 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}